

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

unsigned_long
pstore::serialize::
read<unsigned_long,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
          (range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *archive)

{
  uchar *puVar1;
  long lVar2;
  type uninit_buffer;
  undefined1 in_stack_00000018 [16];
  unsigned_long local_10;
  
  flood<_1l>((span<unsigned_char,__1L>)in_stack_00000018);
  lVar2 = 0;
  puVar1 = (archive->first_)._M_current;
  do {
    (archive->first_)._M_current = puVar1 + 1;
    *(uchar *)((long)&local_10 + lVar2) = *puVar1;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 1;
  } while (lVar2 != 8);
  return local_10;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }